

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
* deqp::gles31::Functional::anon_unknown_1::
  join<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>
            (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
             *__return_storage_ptr__,
            vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
            *a,vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *b)

{
  undefined8 *puVar1;
  pointer pMVar2;
  pointer pMVar3;
  pointer pMVar4;
  long lVar5;
  ulong uVar6;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *this;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          *)(((long)(b->
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(b->
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
            ((long)(a->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(a->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  if (this < (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
              *)0x2aaaaaaaaaaaaab) {
    pMVar2 = (__return_storage_ptr__->
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(__return_storage_ptr__->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar2;
    if ((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
         *)(((long)uVar6 >> 4) * -0x5555555555555555) < this) {
      pMVar3 = (__return_storage_ptr__->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pMVar4 = std::
               _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               ::_M_allocate(this,(size_t)a);
      if (pMVar2 != pMVar3) {
        lVar5 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pMVar2->source + lVar5);
          *(undefined4 *)((long)&pMVar4->severity + lVar5) = *(undefined4 *)(puVar1 + 1);
          *(undefined8 *)((long)&pMVar4->source + lVar5) = *puVar1;
          *(undefined8 *)
           ((long)&(pMVar4->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar5) = puVar1[2];
          *(undefined8 *)
           ((long)&(pMVar4->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + lVar5) = puVar1[3];
          *(undefined8 *)
           ((long)&(pMVar4->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + lVar5) = puVar1[4];
          puVar1[2] = 0;
          puVar1[3] = 0;
          puVar1[4] = 0;
          (&pMVar4->enabled)[lVar5] = *(bool *)(puVar1 + 5);
          lVar5 = lVar5 + 0x30;
        } while ((pointer)(puVar1 + 6) != pMVar3);
      }
      if (pMVar2 != (pointer)0x0) {
        operator_delete(pMVar2,uVar6);
      }
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      )._M_impl.super__Vector_impl_data._M_start = pMVar4;
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(((long)pMVar3 - (long)pMVar2) + (long)pMVar4);
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar4 + (long)this;
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
    ::
    insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>>,void>
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (a->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (a->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
    ::
    insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>>,void>
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (b->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (b->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    return __return_storage_ptr__;
  }
  std::__throw_length_error("vector::reserve");
}

Assistant:

vector<T> join(const vector<T>& a, const vector<T>&b)
{
	vector<T> retval;

	retval.reserve(a.size()+b.size());
	retval.insert(retval.end(), a.begin(), a.end());
	retval.insert(retval.end(), b.begin(), b.end());
	return retval;
}